

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

FilterPropagateResult
duckdb::CheckParquetFloatFilter(ColumnReader *reader,Statistics *pq_col_stats,TableFilter *filter)

{
  int iVar1;
  int iVar2;
  type pBVar3;
  FilterPropagateResult FVar4;
  FilterPropagateResult FVar5;
  LogicalType *other;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  min_max_stats;
  Value nan_value;
  BaseStatistics nan_stats;
  Value local_120;
  LogicalType local_e0;
  Value local_c8;
  BaseStatistics local_88;
  
  other = &reader->column_schema->type;
  LogicalType::LogicalType(&local_e0,other);
  NumericStats::CreateUnknown(&local_88,&local_e0);
  LogicalType::~LogicalType(&local_e0);
  Value::Value(&local_120,"nan");
  Value::DefaultCastAs(&local_c8,&local_120,other,false);
  Value::~Value(&local_120);
  NumericStats::SetMin(&local_88,&local_c8);
  NumericStats::SetMax(&local_88,&local_c8);
  iVar1 = (*filter->_vptr_TableFilter[2])(filter,&local_88);
  ParquetStatisticsUtils::CreateNumericStats
            ((ParquetStatisticsUtils *)&local_120,&reader->column_schema->type,reader->column_schema
             ,pq_col_stats);
  pBVar3 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
           operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)&local_120);
  iVar2 = (*filter->_vptr_TableFilter[2])(filter,pBVar3);
  if ((BaseStatistics *)local_120.type_._0_8_ != (BaseStatistics *)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_120.type_._0_8_);
    operator_delete((void *)local_120.type_._0_8_);
  }
  FVar4 = (FilterPropagateResult)iVar2;
  FVar5 = NO_PRUNING_POSSIBLE;
  if (FVar4 == (FilterPropagateResult)iVar1) {
    FVar5 = FVar4;
  }
  if (FVar4 == NO_PRUNING_POSSIBLE) {
    FVar5 = NO_PRUNING_POSSIBLE;
  }
  if ((FilterPropagateResult)iVar1 == NO_PRUNING_POSSIBLE) {
    FVar5 = NO_PRUNING_POSSIBLE;
  }
  Value::~Value(&local_c8);
  BaseStatistics::~BaseStatistics(&local_88);
  return FVar5;
}

Assistant:

static FilterPropagateResult CheckParquetFloatFilter(ColumnReader &reader, const Statistics &pq_col_stats,
                                                     TableFilter &filter) {
	// floating point values can have values in the [min, max] domain AND nan values
	// check both stats against the filter
	auto &type = reader.Type();
	auto nan_stats = NumericStats::CreateUnknown(type);
	auto nan_value = Value("nan").DefaultCastAs(type);
	NumericStats::SetMin(nan_stats, nan_value);
	NumericStats::SetMax(nan_stats, nan_value);
	auto nan_prune = filter.CheckStatistics(nan_stats);

	auto min_max_stats = ParquetStatisticsUtils::CreateNumericStats(reader.Type(), reader.Schema(), pq_col_stats);
	auto prune = filter.CheckStatistics(*min_max_stats);

	// if EITHER of them cannot be pruned - we cannot prune
	if (prune == FilterPropagateResult::NO_PRUNING_POSSIBLE ||
	    nan_prune == FilterPropagateResult::NO_PRUNING_POSSIBLE) {
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	}
	// if both are the same we can return that value
	if (prune == nan_prune) {
		return prune;
	}
	// if they are different we need to return that we cannot prune
	// e.g. prune = always false, nan_prune = always true -> we don't know
	return FilterPropagateResult::NO_PRUNING_POSSIBLE;
}